

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O1

void __thiscall
TPZVec<TPZFYsmpMatrix<long_double>::TPZMThread>::Resize
          (TPZVec<TPZFYsmpMatrix<long_double>::TPZMThread> *this,int64_t newsize)

{
  TPZMThread *pTVar1;
  undefined1 auVar2 [16];
  ostream *poVar3;
  TPZMThread *pTVar4;
  long lVar5;
  long lVar6;
  undefined8 *puVar7;
  ulong uVar8;
  undefined8 *puVar9;
  long lVar10;
  byte bVar11;
  
  bVar11 = 0;
  if (newsize < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"TPZVec::Resize. Bad parameter newsize: ",0x27);
    poVar3 = std::ostream::_M_insert<long>((long)&std::cerr);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    std::ostream::flush();
  }
  lVar10 = this->fNElements;
  if (lVar10 != newsize) {
    if (newsize == 0) {
      this->fNElements = 0;
      this->fNAlloc = 0;
      if (this->fStore != (TPZMThread *)0x0) {
        operator_delete__(this->fStore);
      }
      this->fStore = (TPZMThread *)0x0;
    }
    else {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = newsize;
      uVar8 = 0xffffffffffffffff;
      if (SUB168(auVar2 * ZEXT816(0x50),8) == 0) {
        uVar8 = SUB168(auVar2 * ZEXT816(0x50),0);
      }
      pTVar4 = (TPZMThread *)operator_new__(uVar8);
      if (newsize <= lVar10) {
        lVar10 = newsize;
      }
      if (0 < lVar10) {
        pTVar1 = this->fStore;
        lVar6 = 0;
        do {
          puVar7 = (undefined8 *)((long)&pTVar1->target + lVar6);
          puVar9 = (undefined8 *)((long)&pTVar4->target + lVar6);
          for (lVar5 = 10; lVar5 != 0; lVar5 = lVar5 + -1) {
            *puVar9 = *puVar7;
            puVar7 = puVar7 + (ulong)bVar11 * -2 + 1;
            puVar9 = puVar9 + (ulong)bVar11 * -2 + 1;
          }
          lVar6 = lVar6 + 0x50;
          lVar10 = lVar10 + -1;
        } while (lVar10 != 0);
      }
      if (this->fStore != (TPZMThread *)0x0) {
        operator_delete__(this->fStore);
      }
      this->fStore = pTVar4;
      this->fNElements = newsize;
      this->fNAlloc = newsize;
    }
  }
  return;
}

Assistant:

void TPZVec<T>::Resize(const int64_t newsize) {
#ifndef PZNODEBUG
    //	int64_t nlongsize = 2147483647;
	if(newsize<0) {
		PZError << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		PZError.flush();
	}
#ifdef WIN32
	// Parece que o limite no windows é
	int sz = sizeof(T);
	int64_t nlongsize = 1704792168;
	if((newsize+1) > (1./sz)*nlongsize) {
		PZError << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		std::cout << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		PZError.flush();
        //		DebugStop();
        //		return;
	}
#endif
#endif
	
	if(newsize == fNElements) return;
	if (newsize == 0) {
		fNElements = 0;
        fNAlloc = 0;
		delete[] fStore;
		fStore = nullptr;
		return;
	}
	T *newstore = new T[newsize];
	int64_t large = (fNElements < newsize) ? fNElements : newsize;
	int64_t i;
	for(i=0L; i<large; i++) {
		newstore[i] = fStore[i];
	}
	if(fStore) delete[] fStore;
	fStore = newstore;
	fNElements = newsize;
    fNAlloc = newsize;
}